

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# domain.cpp
# Opt level: O2

void __thiscall NetworkNS::Domain::Domain(Domain *this,string *filename)

{
  pointer pbVar1;
  istream *piVar2;
  int i;
  long lVar3;
  int iVar4;
  bool bVar5;
  double dVar6;
  undefined1 auVar7 [16];
  double dVar8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  tokens;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  lines_of_file;
  string buf;
  stringstream ss;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3b0 [23];
  ifstream data_file;
  
  this->_vptr_Domain = (_func_int **)&PTR__Domain_0010fd08;
  std::ifstream::ifstream((istream *)&data_file,(filename->_M_dataplus)._M_p,_S_in);
  lines_of_file.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  lines_of_file.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  lines_of_file.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  iVar4 = 0xb;
  while (bVar5 = iVar4 != 0, iVar4 = iVar4 + -1, bVar5) {
    local_3b0[0]._M_local_buf[0] = '\0';
    _ss = (pointer)local_3b0;
    std::getline<char,std::char_traits<char>,std::allocator<char>>
              ((istream *)&data_file,(string *)&ss);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&lines_of_file,(value_type *)&ss);
    std::__cxx11::string::~string((string *)&ss);
  }
  buf._M_dataplus._M_p = (pointer)&buf.field_2;
  buf._M_string_length = 0;
  buf.field_2._M_local_buf[0] = '\0';
  std::__cxx11::stringstream::stringstream((stringstream *)&ss);
  tokens.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  tokens.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  tokens.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  for (lVar3 = 0; lVar3 != 3; lVar3 = lVar3 + 1) {
    std::ostream::flush();
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::clear(&tokens);
    std::operator<<((ostream *)local_3b0[0]._M_local_buf,
                    (string *)
                    (lines_of_file.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start + lVar3 + 8));
    while( true ) {
      piVar2 = std::operator>>((istream *)&ss,(string *)&buf);
      pbVar1 = tokens.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if (((byte)piVar2[*(long *)(*(long *)piVar2 + -0x18) + 0x20] & 5) != 0) break;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&tokens,&buf);
    }
    dVar6 = atof(((tokens.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p);
    this->BoxLow[lVar3] = dVar6;
    dVar6 = atof(pbVar1[1]._M_dataplus._M_p);
    this->BoxHigh[lVar3] = dVar6;
  }
  dVar6 = this->BoxHigh[0] - this->BoxLow[0];
  dVar8 = this->BoxHigh[1] - this->BoxLow[1];
  this->XBoxLen = dVar6;
  this->YBoxLen = dVar8;
  auVar7._8_8_ = dVar8;
  auVar7._0_8_ = dVar6;
  auVar7 = divpd(_DAT_0010b480,auVar7);
  this->iXBoxLen = (double)auVar7._0_8_;
  this->iYBoxLen = (double)auVar7._8_8_;
  dVar6 = this->BoxHigh[2] - this->BoxLow[2];
  this->ZBoxLen = dVar6;
  this->iZBoxLen = 1.0 / dVar6;
  this->BoxExists = 1;
  this->NonPeriodic = 0;
  this->Xperiodic = 1;
  this->Yperiodic = 1;
  this->Zperiodic = 1;
  this->Periodicity[0] = 1;
  this->Periodicity[1] = 1;
  this->Periodicity[2] = 1;
  this->Boundary[0] = (int  [2])0x0;
  this->Boundary[1] = (int  [2])0x0;
  this->Boundary[2] = (int  [2])0x0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&tokens);
  std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
  std::__cxx11::string::~string((string *)&buf);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&lines_of_file);
  std::ifstream::~ifstream(&data_file);
  return;
}

Assistant:

Domain::Domain(std::string filename) {

      ifstream data_file(filename.c_str(), ifstream::in);
      /* Define an array of strings to hold the contents of the file. */
      std::vector <string> lines_of_file;

      for (int i = 0; i < 11; i++) {
         /* A temporary string for the current line of the file. */
         std::string current_line;
         getline(data_file, current_line);
         /* Add current line to file's array of lines. */
         lines_of_file.push_back(current_line);
      }

      /* x box dimension is stored in the 9th line: */
      string buf;
      stringstream ss;
      vector<string> tokens;

      // http://www.cplusplus.com/faq/sequences/strings/split/#boost-split

      for (int i = 0; i < 3; i++) {
         ss.flush();
         tokens.clear();
         ss << lines_of_file[8 + i];
         while (ss >> buf)
            tokens.push_back(buf);
         BoxLow[i] = atof(tokens[0].c_str());
         BoxHigh[i] = atof(tokens[1].c_str());
      }


      XBoxLen = BoxHigh[0] - BoxLow[0];
      iXBoxLen = 1.0 / XBoxLen;

      YBoxLen = BoxHigh[1] - BoxLow[1];
      iYBoxLen = 1.0 / YBoxLen;

      ZBoxLen = BoxHigh[2] - BoxLow[2];
      iZBoxLen = 1.0 / ZBoxLen;

      BoxExists = 1;
      NonPeriodic = 0;
      Xperiodic = Yperiodic = Zperiodic = 1;
      Periodicity[0] = Xperiodic;
      Periodicity[1] = Yperiodic;
      Periodicity[2] = Zperiodic;

      Boundary[0][0] = Boundary[0][1] = 0;
      Boundary[1][0] = Boundary[1][1] = 0;
      Boundary[2][0] = Boundary[2][1] = 0;

      return;
   }